

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txoutproof.cpp
# Opt level: O0

void RegisterTxoutProofRPCCommands(CRPCTable *t)

{
  int iVar1;
  long in_FS_OFFSET;
  CRPCCommand *c;
  CRPCCommand *__end1;
  CRPCCommand *__begin1;
  CRPCCommand (*__range1) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  CRPCTable *in_stack_ffffffffffffff58;
  CRPCCommand *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  CRPCCommand *in_stack_ffffffffffffff78;
  CRPCCommand *pCVar2;
  CRPCCommand *local_80;
  allocator<char> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  allocator<char> local_4a;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterTxoutProofRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterTxoutProofRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff68 = (CRPCCommand *)&stack0xffffffffffffffb7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff98,(char *)CONCAT44(in_stack_ffffffffffffff94,uVar3),
                 in_stack_ffffffffffffff88);
      CRPCCommand::CRPCCommand
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                 (RpcMethodFnType)in_stack_ffffffffffffff68);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff98,(char *)CONCAT44(in_stack_ffffffffffffff94,uVar3),
                 in_stack_ffffffffffffff88);
      CRPCCommand::CRPCCommand
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                 (RpcMethodFnType)in_stack_ffffffffffffff68);
      std::__cxx11::string::~string(in_stack_ffffffffffffff48);
      std::allocator<char>::~allocator(&local_4a);
      std::__cxx11::string::~string(in_stack_ffffffffffffff48);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterTxoutProofRPCCommands(CRPCTable&)::commands);
    }
  }
  pCVar2 = (CRPCCommand *)&RegisterTxoutProofRPCCommands(CRPCTable&)::commands;
  for (local_80 = RegisterTxoutProofRPCCommands::commands; local_80 != pCVar2;
      local_80 = local_80 + 1) {
    CRPCTable::appendCommand
              (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterTxoutProofRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"blockchain", &gettxoutproof},
        {"blockchain", &verifytxoutproof},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}